

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

sunrealtype ** SUNDlsMat_newDenseMat(sunindextype m,sunindextype n)

{
  sunrealtype *psVar1;
  long in_RSI;
  long in_RDI;
  sunrealtype **a;
  sunindextype j;
  long local_20;
  sunrealtype **local_8;
  
  if ((in_RSI < 1) || (in_RDI < 1)) {
    local_8 = (sunrealtype **)0x0;
  }
  else {
    local_8 = (sunrealtype **)malloc(in_RSI << 3);
    if (local_8 == (sunrealtype **)0x0) {
      local_8 = (sunrealtype **)0x0;
    }
    else {
      *local_8 = (sunrealtype *)0x0;
      psVar1 = (sunrealtype *)malloc(in_RDI * in_RSI * 8);
      *local_8 = psVar1;
      if (*local_8 == (sunrealtype *)0x0) {
        free(local_8);
        local_8 = (sunrealtype **)0x0;
      }
      else {
        for (local_20 = 1; local_20 < in_RSI; local_20 = local_20 + 1) {
          local_8[local_20] = *local_8 + local_20 * in_RDI;
        }
      }
    }
  }
  return local_8;
}

Assistant:

sunrealtype** SUNDlsMat_newDenseMat(sunindextype m, sunindextype n)
{
  sunindextype j;
  sunrealtype** a;

  if ((n <= 0) || (m <= 0)) { return (NULL); }

  a = NULL;
  a = (sunrealtype**)malloc(n * sizeof(sunrealtype*));
  if (a == NULL) { return (NULL); }

  a[0] = NULL;
  a[0] = (sunrealtype*)malloc(m * n * sizeof(sunrealtype));
  if (a[0] == NULL)
  {
    free(a);
    a = NULL;
    return (NULL);
  }

  for (j = 1; j < n; j++) { a[j] = a[0] + j * m; }

  return (a);
}